

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O1

int fy_parse_peek_at(fy_parser *fyp,int pos)

{
  int iVar1;
  long lVar2;
  size_t offset;
  
  if (pos < 1) {
    offset = 0;
  }
  else {
    offset = 0;
    do {
      iVar1 = fy_parse_peek_at_offset(fyp,offset);
      if (iVar1 < 0) {
        return iVar1;
      }
      lVar2 = 1;
      if ((0x7f < iVar1) && (lVar2 = 2, 0x7ff < iVar1)) {
        lVar2 = (ulong)(0xffff < iVar1) + 3;
      }
      offset = offset + lVar2;
      pos = pos + -1;
    } while (pos != 0);
  }
  iVar1 = fy_parse_peek_at_offset(fyp,offset);
  return iVar1;
}

Assistant:

static inline int fy_parse_peek_at(struct fy_parser *fyp, int pos) {
    return fy_parse_peek_at_internal(fyp, pos, NULL);
}